

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_vectordivide_numerators<(libdivide::Branching)0>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)0> *the_divider)

{
  long lVar1;
  long in_RDX;
  size_t in_RSI;
  DivideTest<long> *in_RDI;
  DivideTest<long> *unaff_retaddr;
  size_t j;
  size_t i;
  long *numers;
  size_t offset;
  char mem [128];
  ulong local_b8;
  ulong local_b0;
  undefined1 local_98 [64];
  long alStack_58 [7];
  divider<long,_(libdivide::Branching)0> *in_stack_ffffffffffffffe0;
  DivideTest<long> *numers_00;
  
  numers_00 = in_RDI;
  for (local_b0 = 0; local_b0 < 10000; local_b0 = local_b0 + 1) {
    for (local_b8 = 0; local_b8 < 8; local_b8 = local_b8 + 1) {
      lVar1 = get_random(in_RDI);
      *(long *)((long)alStack_58 + (local_b8 * 8 - ((ulong)local_98 & 0x3f))) = lVar1;
    }
    test_vec<long_long__vector(2),(libdivide::Branching)0>
              (unaff_retaddr,(long *)numers_00,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    test_vec<long_long__vector(4),(libdivide::Branching)0>
              ((DivideTest<long> *)mem._16_8_,(long *)mem._8_8_,mem._0_8_,offset,
               (divider<long,_(libdivide::Branching)0> *)numers);
    test_vec<long_long__vector(8),(libdivide::Branching)0>
              ((DivideTest<long> *)mem._112_8_,(long *)mem._104_8_,mem._96_8_,mem._88_8_,
               (divider<long,_(libdivide::Branching)0> *)mem._80_8_);
  }
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }